

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Insert_Y_Turn(black_PWorker worker,Int y)

{
  int iVar1;
  PLong plVar2;
  long lVar3;
  bool bVar4;
  int local_2c;
  Int y2;
  Int n;
  PLong y_turns;
  Int y_local;
  black_PWorker worker_local;
  
  local_2c = worker->numTurns;
  plVar2 = worker->sizeBuff;
  iVar1 = worker->numTurns;
  do {
    local_2c = local_2c + -1;
    bVar4 = false;
    if (-1 < local_2c) {
      bVar4 = (long)y < plVar2[(long)local_2c - (long)iVar1];
    }
  } while (bVar4);
  y_turns._4_4_ = y;
  if ((-1 < local_2c) && (y_turns._4_4_ = y, plVar2[(long)local_2c - (long)iVar1] < (long)y)) {
    do {
      lVar3 = plVar2[(long)local_2c - (long)iVar1];
      plVar2[(long)local_2c - (long)iVar1] = (long)y_turns._4_4_;
      local_2c = local_2c + -1;
      y_turns._4_4_ = (int)lVar3;
    } while (-1 < local_2c);
  }
  if (local_2c < 0) {
    worker->maxBuff = worker->maxBuff + -1;
    if (worker->maxBuff <= worker->top) {
      worker->error = 0x62;
      return '\x01';
    }
    worker->numTurns = worker->numTurns + 1;
    worker->sizeBuff[-worker->numTurns] = (long)y_turns._4_4_;
  }
  return '\0';
}

Assistant:

static Bool
  Insert_Y_Turn( RAS_ARGS Int  y )
  {
    PLong  y_turns;
    Int    n;


    n       = ras.numTurns - 1;
    y_turns = ras.sizeBuff - ras.numTurns;

    /* look for first y value that is <= */
    while ( n >= 0 && y < y_turns[n] )
      n--;

    /* if it is <, simply insert it, ignore if == */
    if ( n >= 0 && y > y_turns[n] )
      do
      {
        Int  y2 = (Int)y_turns[n];


        y_turns[n] = y;
        y = y2;
      } while ( --n >= 0 );

    if ( n < 0 )
    {
      ras.maxBuff--;
      if ( ras.maxBuff <= ras.top )
      {
        ras.error = FT_THROW( Raster_Overflow );
        return FAILURE;
      }
      ras.numTurns++;
      ras.sizeBuff[-ras.numTurns] = y;
    }

    return SUCCESS;
  }